

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_7_channels_with_10_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  undefined8 *puVar1;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  int in_R9D;
  undefined8 *local_758;
  undefined8 *local_740;
  int *local_738;
  float fStack_574;
  float local_568;
  float fStack_54c;
  float fStack_540;
  float fStack_534;
  float local_528;
  float fStack_50c;
  float fStack_500;
  float fStack_4f4;
  float local_4e8;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  __m128 cs;
  __m128 c;
  __m128 tot3;
  __m128 tot2;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  
  local_758 = in_RDI;
  local_740 = in_R8;
  local_738 = in_RCX;
  do {
    puVar1 = (undefined8 *)(in_RDX + (long)(*local_738 * 7) * 4);
    local_4e8 = (float)*local_740;
    local_278 = (float)*puVar1;
    fStack_274 = (float)((ulong)*puVar1 >> 0x20);
    fStack_270 = (float)puVar1[1];
    fStack_26c = (float)((ulong)puVar1[1] >> 0x20);
    local_298 = (float)*(undefined8 *)((long)puVar1 + 0xc);
    fStack_294 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xc) >> 0x20);
    fStack_290 = (float)*(undefined8 *)((long)puVar1 + 0x14);
    fStack_28c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x14) >> 0x20);
    fStack_4f4 = (float)((ulong)*local_740 >> 0x20);
    local_2b8 = (float)*(undefined8 *)((long)puVar1 + 0x1c);
    fStack_2b4 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x1c) >> 0x20);
    fStack_2b0 = (float)*(undefined8 *)((long)puVar1 + 0x24);
    fStack_2ac = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x24) >> 0x20);
    local_2d8 = (float)puVar1[5];
    fStack_2d4 = (float)((ulong)puVar1[5] >> 0x20);
    fStack_2d0 = (float)puVar1[6];
    fStack_2cc = (float)((ulong)puVar1[6] >> 0x20);
    fStack_500 = (float)local_740[1];
    local_2f8 = (float)puVar1[7];
    fStack_2f4 = (float)((ulong)puVar1[7] >> 0x20);
    fStack_2f0 = (float)puVar1[8];
    fStack_2ec = (float)((ulong)puVar1[8] >> 0x20);
    local_318 = (float)*(undefined8 *)((long)puVar1 + 0x44);
    fStack_314 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x44) >> 0x20);
    fStack_310 = (float)*(undefined8 *)((long)puVar1 + 0x4c);
    fStack_30c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x4c) >> 0x20);
    fStack_50c = (float)((ulong)local_740[1] >> 0x20);
    local_338 = (float)*(undefined8 *)((long)puVar1 + 0x54);
    fStack_334 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x54) >> 0x20);
    fStack_330 = (float)*(undefined8 *)((long)puVar1 + 0x5c);
    fStack_32c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x5c) >> 0x20);
    local_358 = (float)puVar1[0xc];
    fStack_354 = (float)((ulong)puVar1[0xc] >> 0x20);
    fStack_350 = (float)puVar1[0xd];
    fStack_34c = (float)((ulong)puVar1[0xd] >> 0x20);
    local_528 = (float)local_740[2];
    local_378 = (float)puVar1[0xe];
    fStack_374 = (float)((ulong)puVar1[0xe] >> 0x20);
    fStack_370 = (float)puVar1[0xf];
    fStack_36c = (float)((ulong)puVar1[0xf] >> 0x20);
    local_398 = (float)*(undefined8 *)((long)puVar1 + 0x7c);
    fStack_394 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x7c) >> 0x20);
    fStack_390 = (float)*(undefined8 *)((long)puVar1 + 0x84);
    fStack_38c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x84) >> 0x20);
    fStack_534 = (float)((ulong)local_740[2] >> 0x20);
    local_3b8 = (float)*(undefined8 *)((long)puVar1 + 0x8c);
    fStack_3b4 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x8c) >> 0x20);
    fStack_3b0 = (float)*(undefined8 *)((long)puVar1 + 0x94);
    fStack_3ac = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x94) >> 0x20);
    local_3d8 = (float)puVar1[0x13];
    fStack_3d4 = (float)((ulong)puVar1[0x13] >> 0x20);
    fStack_3d0 = (float)puVar1[0x14];
    fStack_3cc = (float)((ulong)puVar1[0x14] >> 0x20);
    fStack_540 = (float)local_740[3];
    local_3f8 = (float)puVar1[0x15];
    fStack_3f4 = (float)((ulong)puVar1[0x15] >> 0x20);
    fStack_3f0 = (float)puVar1[0x16];
    fStack_3ec = (float)((ulong)puVar1[0x16] >> 0x20);
    local_418 = (float)*(undefined8 *)((long)puVar1 + 0xb4);
    fStack_414 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xb4) >> 0x20);
    fStack_410 = (float)*(undefined8 *)((long)puVar1 + 0xbc);
    fStack_40c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xbc) >> 0x20);
    fStack_54c = (float)((ulong)local_740[3] >> 0x20);
    local_438 = (float)*(undefined8 *)((long)puVar1 + 0xc4);
    fStack_434 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xc4) >> 0x20);
    fStack_430 = (float)*(undefined8 *)((long)puVar1 + 0xcc);
    fStack_42c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xcc) >> 0x20);
    local_458 = (float)puVar1[0x1a];
    fStack_454 = (float)((ulong)puVar1[0x1a] >> 0x20);
    fStack_450 = (float)puVar1[0x1b];
    fStack_44c = (float)((ulong)puVar1[0x1b] >> 0x20);
    local_568 = (float)local_740[4];
    local_478 = (float)puVar1[0x1c];
    fStack_474 = (float)((ulong)puVar1[0x1c] >> 0x20);
    fStack_470 = (float)puVar1[0x1d];
    fStack_46c = (float)((ulong)puVar1[0x1d] >> 0x20);
    local_498 = (float)*(undefined8 *)((long)puVar1 + 0xec);
    fStack_494 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xec) >> 0x20);
    fStack_490 = (float)*(undefined8 *)((long)puVar1 + 0xf4);
    fStack_48c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xf4) >> 0x20);
    fStack_574 = (float)((ulong)local_740[4] >> 0x20);
    local_4b8 = (float)*(undefined8 *)((long)puVar1 + 0xfc);
    fStack_4b4 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xfc) >> 0x20);
    fStack_4b0 = (float)*(undefined8 *)((long)puVar1 + 0x104);
    fStack_4ac = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x104) >> 0x20);
    local_4d8 = (float)puVar1[0x21];
    fStack_4d4 = (float)((ulong)puVar1[0x21] >> 0x20);
    fStack_4d0 = (float)puVar1[0x22];
    fStack_4cc = (float)((ulong)puVar1[0x22] >> 0x20);
    *(ulong *)((long)local_758 + 0xc) =
         CONCAT44(local_4e8 * fStack_294 + fStack_500 * fStack_314 + local_528 * fStack_394 +
                  fStack_540 * fStack_414 + local_568 * fStack_494 +
                  fStack_4f4 * fStack_2d4 + fStack_50c * fStack_354 + fStack_534 * fStack_3d4 +
                  fStack_54c * fStack_454 + fStack_574 * fStack_4d4,
                  local_4e8 * local_298 + fStack_500 * local_318 + local_528 * local_398 +
                  fStack_540 * local_418 + local_568 * local_498 +
                  fStack_4f4 * local_2d8 + fStack_50c * local_358 + fStack_534 * local_3d8 +
                  fStack_54c * local_458 + fStack_574 * local_4d8);
    *(ulong *)((long)local_758 + 0x14) =
         CONCAT44(local_4e8 * fStack_28c + fStack_500 * fStack_30c + local_528 * fStack_38c +
                  fStack_540 * fStack_40c + local_568 * fStack_48c +
                  fStack_4f4 * fStack_2cc + fStack_50c * fStack_34c + fStack_534 * fStack_3cc +
                  fStack_54c * fStack_44c + fStack_574 * fStack_4cc,
                  local_4e8 * fStack_290 + fStack_500 * fStack_310 + local_528 * fStack_390 +
                  fStack_540 * fStack_410 + local_568 * fStack_490 +
                  fStack_4f4 * fStack_2d0 + fStack_50c * fStack_350 + fStack_534 * fStack_3d0 +
                  fStack_54c * fStack_450 + fStack_574 * fStack_4d0);
    *local_758 = CONCAT44(local_4e8 * fStack_274 + fStack_500 * fStack_2f4 + local_528 * fStack_374
                          + fStack_540 * fStack_3f4 + local_568 * fStack_474 +
                          fStack_4f4 * fStack_2b4 + fStack_50c * fStack_334 +
                          fStack_534 * fStack_3b4 + fStack_54c * fStack_434 +
                          fStack_574 * fStack_4b4,
                          local_4e8 * local_278 + fStack_500 * local_2f8 + local_528 * local_378 +
                          fStack_540 * local_3f8 + local_568 * local_478 +
                          fStack_4f4 * local_2b8 + fStack_50c * local_338 + fStack_534 * local_3b8 +
                          fStack_54c * local_438 + fStack_574 * local_4b8);
    local_758[1] = CONCAT44(local_4e8 * fStack_26c + fStack_500 * fStack_2ec +
                            local_528 * fStack_36c + fStack_540 * fStack_3ec +
                            local_568 * fStack_46c +
                            fStack_4f4 * fStack_2ac + fStack_50c * fStack_32c +
                            fStack_534 * fStack_3ac + fStack_54c * fStack_42c +
                            fStack_574 * fStack_4ac,
                            local_4e8 * fStack_270 + fStack_500 * fStack_2f0 +
                            local_528 * fStack_370 + fStack_540 * fStack_3f0 +
                            local_568 * fStack_470 +
                            fStack_4f4 * fStack_2b0 + fStack_50c * fStack_330 +
                            fStack_534 * fStack_3b0 + fStack_54c * fStack_430 +
                            fStack_574 * fStack_4b0);
    local_740 = (undefined8 *)((long)local_740 + (long)in_R9D * 4);
    local_738 = local_738 + 2;
    local_758 = (undefined8 *)((long)local_758 + 0x1c);
  } while (local_758 < (undefined8 *)((long)in_RDI + (ulong)(uint)(in_ESI * 7) * 4));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_10_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__2_coeff_remnant(8);
    stbir__store_output();
  } while ( output < output_end );
}